

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HL1MDLLoader.cpp
# Opt level: O1

void __thiscall
Assimp::MDL::HalfLife::HL1MDLLoader::read_texture
          (HL1MDLLoader *this,Texture_HL1 *ptexture,uint8_t *data,uint8_t *pal,aiTexture *pResult,
          aiColor3D *last_palette_color)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  ai_uint32 aVar7;
  size_t sVar8;
  aiTexel *paVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  float fVar15;
  int col2 [256];
  int col1 [256];
  int row2 [256];
  int row1 [256];
  int aiStack_1038 [256];
  int aiStack_c38 [256];
  int aiStack_838 [256];
  int aiStack_438 [258];
  
  uVar13 = 1;
  do {
    uVar10 = uVar13;
    uVar13 = uVar10 * 2;
  } while ((int)uVar10 < ptexture->width);
  uVar13 = 1;
  do {
    uVar11 = uVar13;
    uVar13 = uVar11 * 2;
  } while ((int)uVar11 < ptexture->height);
  uVar13 = 0x100;
  if ((int)uVar10 < 0x100) {
    uVar13 = uVar10;
  }
  uVar6 = 0x100;
  if ((int)uVar11 < 0x100) {
    uVar6 = uVar11;
  }
  sVar8 = strlen(ptexture->name);
  aVar7 = (ai_uint32)sVar8;
  if ((int)aVar7 < 0x400) {
    (pResult->mFilename).length = aVar7;
    memcpy((pResult->mFilename).data,ptexture,(long)(int)aVar7);
    (pResult->mFilename).data[(int)aVar7] = '\0';
  }
  pResult->mWidth = uVar13;
  pResult->mHeight = uVar6;
  builtin_strncpy(pResult->achFormatHint,"bgra8888",9);
  uVar12 = 0xffffffffffffffff;
  if (-1 < (int)(uVar6 * uVar13)) {
    uVar12 = (long)(int)(uVar6 * uVar13) * 4;
  }
  paVar9 = (aiTexel *)operator_new__(uVar12);
  pResult->pcData = paVar9;
  if (0 < (int)uVar10) {
    fVar15 = (float)ptexture->width / (float)(int)uVar13;
    uVar12 = 0;
    do {
      aiStack_c38[uVar12] = (int)(((float)(int)uVar12 + 0.25) * fVar15);
      aiStack_1038[uVar12] = (int)(((float)(int)uVar12 + 0.75) * fVar15);
      uVar12 = uVar12 + 1;
    } while (uVar13 != uVar12);
  }
  if (0 < (int)uVar11) {
    fVar15 = (float)ptexture->height / (float)(int)uVar6;
    iVar1 = ptexture->width;
    uVar12 = 0;
    do {
      aiStack_438[uVar12] = (int)(((float)(int)uVar12 + 0.25) * fVar15) * iVar1;
      aiStack_838[uVar12] = (int)(((float)(int)uVar12 + 0.75) * fVar15) * iVar1;
      uVar12 = uVar12 + 1;
    } while (uVar6 != uVar12);
  }
  if (0 < (int)uVar11) {
    uVar12 = 0;
    do {
      if (0 < (int)uVar10) {
        lVar5 = 0;
        do {
          lVar14 = lVar5;
          lVar5 = (ulong)data[*(int *)((long)aiStack_c38 + lVar14) + aiStack_438[uVar12]] * 3;
          lVar2 = (ulong)data[aiStack_438[uVar12] + *(int *)((long)aiStack_1038 + lVar14)] * 3;
          lVar3 = (ulong)data[*(int *)((long)aiStack_c38 + lVar14) + aiStack_838[uVar12]] * 3;
          lVar4 = (ulong)data[aiStack_838[uVar12] + *(int *)((long)aiStack_1038 + lVar14)] * 3;
          (&paVar9->r)[lVar14] =
               (uchar)((uint)pal[lVar4] + (uint)pal[lVar3] + (uint)pal[lVar2] + (uint)pal[lVar5] >>
                      2);
          (&paVar9->g)[lVar14] =
               (uchar)((uint)pal[lVar4 + 1] + (uint)pal[lVar3 + 1] +
                       (uint)pal[lVar2 + 1] + (uint)pal[lVar5 + 1] >> 2);
          (&paVar9->b)[lVar14] =
               (uchar)((uint)pal[lVar4 + 2] + (uint)pal[lVar3 + 2] +
                       (uint)pal[lVar2 + 2] + (uint)pal[lVar5 + 2] >> 2);
          (&paVar9->a)[lVar14] = 0xff;
          lVar5 = lVar14 + 4;
        } while ((ulong)uVar13 << 2 != lVar14 + 4);
        paVar9 = (aiTexel *)(&paVar9[1].b + lVar14);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar6);
  }
  last_palette_color->r = (float)pal[0x2fd];
  last_palette_color->g = (float)pal[0x2fe];
  last_palette_color->b = (float)pal[0x2ff];
  return;
}

Assistant:

void HL1MDLLoader::read_texture(const Texture_HL1 *ptexture,
        uint8_t *data, uint8_t *pal, aiTexture *pResult,
        aiColor3D &last_palette_color) {
    int outwidth, outheight;
    int i, j;
    int row1[256], row2[256], col1[256], col2[256];
    unsigned char *pix1, *pix2, *pix3, *pix4;

    // convert texture to power of 2
    for (outwidth = 1; outwidth < ptexture->width; outwidth <<= 1)
        ;

    if (outwidth > 256)
        outwidth = 256;

    for (outheight = 1; outheight < ptexture->height; outheight <<= 1)
        ;

    if (outheight > 256)
        outheight = 256;

    pResult->mFilename = ptexture->name;
    pResult->mWidth = outwidth;
    pResult->mHeight = outheight;
    pResult->achFormatHint[0] = 'b';
    pResult->achFormatHint[1] = 'g';
    pResult->achFormatHint[2] = 'r';
    pResult->achFormatHint[3] = 'a';
    pResult->achFormatHint[4] = '8';
    pResult->achFormatHint[5] = '8';
    pResult->achFormatHint[6] = '8';
    pResult->achFormatHint[7] = '8';
    pResult->achFormatHint[8] = '\0';

    aiTexel *out = pResult->pcData = new aiTexel[outwidth * outheight];

    for (i = 0; i < outwidth; i++) {
        col1[i] = (int)((i + 0.25) * (ptexture->width / (float)outwidth));
        col2[i] = (int)((i + 0.75) * (ptexture->width / (float)outwidth));
    }

    for (i = 0; i < outheight; i++) {
        row1[i] = (int)((i + 0.25) * (ptexture->height / (float)outheight)) * ptexture->width;
        row2[i] = (int)((i + 0.75) * (ptexture->height / (float)outheight)) * ptexture->width;
    }

    // scale down and convert to 32bit RGB
    for (i = 0; i < outheight; i++) {
        for (j = 0; j < outwidth; j++, out++) {
            pix1 = &pal[data[row1[i] + col1[j]] * 3];
            pix2 = &pal[data[row1[i] + col2[j]] * 3];
            pix3 = &pal[data[row2[i] + col1[j]] * 3];
            pix4 = &pal[data[row2[i] + col2[j]] * 3];

            out->r = (pix1[0] + pix2[0] + pix3[0] + pix4[0]) >> 2;
            out->g = (pix1[1] + pix2[1] + pix3[1] + pix4[1]) >> 2;
            out->b = (pix1[2] + pix2[2] + pix3[2] + pix4[2]) >> 2;
            out->a = 0xFF;
        }
    }

    // Get the last palette color.
    last_palette_color.r = pal[255 * 3];
    last_palette_color.g = pal[255 * 3 + 1];
    last_palette_color.b = pal[255 * 3 + 2];
}